

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnniint8.cpp
# Opt level: O3

void ncnn::pack_B_tile_int8_avxvnniint8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [32];
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 *puVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar20 [32];
  
  auVar3 = _DAT_005b2820;
  pauVar4 = (undefined1 (*) [32])BT->data;
  uVar6 = 0;
  lVar10 = (long)k;
  lVar5 = (long)j;
  if (7 < max_jj) {
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar18._8_4_ = 0xc080400;
    auVar18._0_8_ = 0xc0804000c080400;
    auVar18._12_4_ = 0xc080400;
    auVar18._16_4_ = 0xc080400;
    auVar18._20_4_ = 0xc080400;
    auVar18._24_4_ = 0xc080400;
    auVar18._28_4_ = 0xc080400;
    uVar14 = 0;
    do {
      iVar8 = B->w;
      auVar20._4_4_ = iVar8;
      auVar20._0_4_ = iVar8;
      auVar20._8_4_ = iVar8;
      auVar20._12_4_ = iVar8;
      auVar20._16_4_ = iVar8;
      auVar20._20_4_ = iVar8;
      auVar20._24_4_ = iVar8;
      auVar20._28_4_ = iVar8;
      vpmulld_avx2(auVar20,auVar2);
      if (max_kk < 4) {
        uVar15 = 0;
      }
      else {
        iVar8 = 3;
        do {
          auVar20 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
          auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
          in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
          *pauVar4 = auVar20;
          pauVar4 = pauVar4 + 1;
          iVar8 = iVar8 + 4;
          uVar15 = max_kk & 0xfffffffc;
        } while (iVar8 < max_kk);
      }
      uVar9 = uVar15 | 1;
      while ((int)uVar9 < max_kk) {
        auVar20 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
        auVar20 = vpshufb_avx2(auVar20,auVar3);
        auVar20 = vpermq_avx2(auVar20,0xe8);
        in_ZMM4 = ZEXT3264(auVar20);
        *(undefined1 (*) [16])*pauVar4 = auVar20._0_16_;
        pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 0x10);
        uVar9 = uVar15 + 3;
        uVar15 = uVar15 + 2;
      }
      iVar8 = max_kk - uVar15;
      if (iVar8 != 0 && (int)uVar15 <= max_kk) {
        do {
          auVar20 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
          auVar20 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar20);
          auVar20 = vpshufb_avx2(auVar20,auVar18);
          auVar1 = vpunpckldq_avx(auVar20._0_16_,auVar20._16_16_);
          in_ZMM4 = ZEXT1664(auVar1);
          *(long *)*pauVar4 = auVar1._0_8_;
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 8);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar6 = uVar14 + 8;
      uVar12 = uVar14 + 0xf;
      uVar14 = uVar6;
    } while (uVar12 < (uint)max_jj);
  }
  lVar11 = (long)max_jj;
  if ((int)((uint)uVar6 | 3) < max_jj) {
    auVar1 = vpmovsxbd_avx(ZEXT416(0x3020100));
    uVar14 = uVar6 & 0xffffffff;
    do {
      iVar8 = B->w;
      auVar19._4_4_ = iVar8;
      auVar19._0_4_ = iVar8;
      auVar19._8_4_ = iVar8;
      auVar19._12_4_ = iVar8;
      vpmulld_avx(auVar19,auVar1);
      uVar15 = 0;
      if (3 < max_kk) {
        iVar8 = 3;
        do {
          auVar19 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
          in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
          *(undefined1 (*) [16])*pauVar4 = auVar19;
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 0x10);
          iVar8 = iVar8 + 4;
          uVar15 = max_kk & 0xfffffffc;
        } while (iVar8 < max_kk);
      }
      uVar9 = uVar15 | 1;
      while ((int)uVar9 < max_kk) {
        auVar19 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
        auVar19 = vpshufb_avx(auVar19,ZEXT816(0xd0c090805040100));
        in_ZMM4 = ZEXT1664(auVar19);
        *(long *)*pauVar4 = auVar19._0_8_;
        pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 8);
        uVar9 = uVar15 + 3;
        uVar15 = uVar15 + 2;
      }
      iVar8 = max_kk - uVar15;
      if (iVar8 != 0 && (int)uVar15 <= max_kk) {
        do {
          auVar19 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar19 = vpgatherdd((undefined1  [16])0x0,auVar19);
          auVar19 = vpshufb_avx(auVar19,SUB6416(ZEXT464(0xc080400),0));
          in_ZMM4 = ZEXT1664(auVar19);
          *(int *)*pauVar4 = auVar19._0_4_;
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 4);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar6 = uVar14 + 4;
      lVar13 = uVar14 + 7;
      uVar14 = uVar6;
    } while (lVar13 < lVar11);
  }
  if ((int)((uint)uVar6 | 1) < max_jj) {
    uVar14 = uVar6 & 0xffffffff;
    do {
      lVar13 = (long)B->w * B->elemsize;
      puVar7 = (undefined1 *)((long)B->data + (uVar14 + lVar5) * lVar13 + lVar10);
      puVar16 = (undefined1 *)((long)B->data + (uVar14 + lVar5 + 1) * lVar13 + lVar10);
      if (max_kk < 4) {
        uVar15 = 0;
      }
      else {
        iVar8 = 3;
        do {
          (*pauVar4)[0] = *puVar7;
          *(undefined1 *)((long)*pauVar4 + 1) = puVar7[1];
          *(undefined1 *)((long)*pauVar4 + 2) = puVar7[2];
          *(undefined1 *)((long)*pauVar4 + 3) = puVar7[3];
          *(undefined1 *)((long)*pauVar4 + 4) = *puVar16;
          *(undefined1 *)((long)*pauVar4 + 5) = puVar16[1];
          *(undefined1 *)((long)*pauVar4 + 6) = puVar16[2];
          *(undefined1 *)((long)*pauVar4 + 7) = puVar16[3];
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 8);
          puVar7 = puVar7 + 4;
          puVar16 = puVar16 + 4;
          iVar8 = iVar8 + 4;
          uVar15 = max_kk & 0xfffffffc;
        } while (iVar8 < max_kk);
      }
      uVar9 = uVar15 | 1;
      while ((int)uVar9 < max_kk) {
        (*pauVar4)[0] = *puVar7;
        *(undefined1 *)((long)*pauVar4 + 1) = puVar7[1];
        *(undefined1 *)((long)*pauVar4 + 2) = *puVar16;
        *(undefined1 *)((long)*pauVar4 + 3) = puVar16[1];
        pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 4);
        puVar7 = puVar7 + 2;
        puVar16 = puVar16 + 2;
        uVar9 = uVar15 + 3;
        uVar15 = uVar15 + 2;
      }
      if ((int)uVar15 < max_kk) {
        lVar13 = 0;
        do {
          (*pauVar4)[0] = puVar7[lVar13];
          *(undefined1 *)((long)*pauVar4 + 1) = puVar16[lVar13];
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 2);
          lVar13 = lVar13 + 1;
        } while (max_kk - uVar15 != (int)lVar13);
      }
      uVar6 = uVar14 + 2;
      lVar13 = uVar14 + 3;
      uVar14 = uVar6;
    } while (lVar13 < lVar11);
  }
  if ((int)uVar6 < max_jj) {
    lVar13 = (long)(int)uVar6;
    do {
      puVar7 = (undefined1 *)((long)B->data + lVar10 + (long)B->w * (lVar13 + lVar5) * B->elemsize);
      if (max_kk < 4) {
        uVar15 = 0;
      }
      else {
        iVar8 = 3;
        do {
          (*pauVar4)[0] = *puVar7;
          *(undefined1 *)((long)*pauVar4 + 1) = puVar7[1];
          *(undefined1 *)((long)*pauVar4 + 2) = puVar7[2];
          *(undefined1 *)((long)*pauVar4 + 3) = puVar7[3];
          pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + 4);
          puVar7 = puVar7 + 4;
          iVar8 = iVar8 + 4;
          uVar15 = max_kk & 0xfffffffc;
        } while (iVar8 < max_kk);
      }
      if ((int)uVar15 < max_kk) {
        lVar17 = 0;
        do {
          *(undefined1 *)((long)*pauVar4 + lVar17) = puVar7[lVar17];
          lVar17 = lVar17 + 1;
        } while (max_kk - uVar15 != (int)lVar17);
        pauVar4 = (undefined1 (*) [32])((long)*pauVar4 + lVar17);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11);
  }
  return;
}

Assistant:

void pack_B_tile_int8_avxvnniint8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}